

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

uint8_t * __thiscall
FastPForLib::VariableByte::decodeFromByteArray<unsigned_long>
          (VariableByte *this,uint8_t *inbyte,size_t length,unsigned_long *out,size_t *nvalue)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  byte *pbVar5;
  unsigned_long *puVar6;
  size_t sVar7;
  uint uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  unsigned_long v;
  
  if (length == 0) {
    sVar7 = 0;
  }
  else {
    pbVar5 = inbyte + length;
    puVar6 = out;
    while (pbVar1 = inbyte + 10, pbVar1 < pbVar5) {
      uVar8 = *inbyte & 0x7f;
      uVar9 = (unsigned_long)uVar8;
      if ((char)*inbyte < '\0') {
        inbyte = inbyte + 1;
      }
      else {
        uVar8 = uVar8 | (inbyte[1] & 0x7f) << 7;
        uVar9 = (unsigned_long)uVar8;
        if ((char)inbyte[1] < '\0') {
          inbyte = inbyte + 2;
        }
        else {
          uVar8 = uVar8 | (inbyte[2] & 0x7f) << 0xe;
          uVar9 = (unsigned_long)uVar8;
          if ((char)inbyte[2] < '\0') {
            inbyte = inbyte + 3;
          }
          else {
            uVar9 = (unsigned_long)(uVar8 | (inbyte[3] & 0x7f) << 0x15);
            if ((char)inbyte[3] < '\0') {
              inbyte = inbyte + 4;
            }
            else {
              uVar9 = uVar9 | (ulong)(inbyte[4] & 0x7f) << 0x1c;
              if ((char)inbyte[4] < '\0') {
                inbyte = inbyte + 5;
              }
              else {
                uVar9 = uVar9 | (ulong)(inbyte[5] & 0x7f) << 0x23;
                if ((char)inbyte[5] < '\0') {
                  inbyte = inbyte + 6;
                }
                else {
                  uVar9 = uVar9 | (ulong)(inbyte[6] & 0x7f) << 0x2a;
                  if ((char)inbyte[6] < '\0') {
                    inbyte = inbyte + 7;
                  }
                  else {
                    uVar9 = uVar9 | (ulong)(inbyte[7] & 0x7f) << 0x31;
                    if ((char)inbyte[7] < '\0') {
                      inbyte = inbyte + 8;
                    }
                    else {
                      pbVar2 = inbyte + 8;
                      inbyte = inbyte + 9;
                      uVar9 = uVar9 | (ulong)(*pbVar2 & 0x7f) << 0x38;
                      if (-1 < (char)*pbVar2) {
                        uVar9 = uVar9 | (ulong)*inbyte << 0x3f;
                        inbyte = pbVar1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      *puVar6 = uVar9;
      puVar6 = puVar6 + 1;
    }
LAB_00151744:
    if (inbyte < pbVar5) {
      uVar10 = 0;
      uVar9 = 0;
      do {
        if (pbVar5 <= inbyte) goto LAB_00151744;
        bVar3 = *inbyte;
        inbyte = inbyte + 1;
        uVar4 = uVar10 & 0x3f;
        uVar10 = (ulong)((int)uVar10 + 7);
        uVar9 = uVar9 + ((ulong)(bVar3 & 0x7f) << uVar4);
      } while (-1 < (char)bVar3);
      *puVar6 = uVar9;
      puVar6 = puVar6 + 1;
      goto LAB_00151744;
    }
    sVar7 = (long)puVar6 - (long)out >> 3;
  }
  *nvalue = sVar7;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     T *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const T *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 10) {
      uint64_t c;
      T v = 0;

      c = inbyte[0];
      v = c & 0x7F;
      if (c >= 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c >= 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c >= 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c >= 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      v |= (c & 0x7F) << 28;
      if (c >= 128) {
        inbyte += 5;
        *out++ = v;
        continue;
      }

      c = inbyte[5];
      v |= static_cast<uint64_t>(c & 0x7F) << 35;
      if (c >= 128) {
        inbyte += 6;
        *out++ = v;
        continue;
      }

      c = inbyte[6];
      v |= static_cast<uint64_t>(c & 0x7F) << 42;
      if (c >= 128) {
        inbyte += 7;
        *out++ = v;
        continue;
      }

      c = inbyte[7];
      v |= static_cast<uint64_t>(c & 0x7F) << 49;
      if (c >= 128) {
        inbyte += 8;
        *out++ = v;
        continue;
      }

      c = inbyte[8];
      v |= static_cast<uint64_t>(c & 0x7F) << 56;
      if (c >= 128) {
        inbyte += 9;
        *out++ = v;
        continue;
      }

      c = inbyte[9];
      inbyte += 10;
      v |= static_cast<uint64_t>(c & 0x1) << 63;
      *out++ = v;
    }

    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (T v = 0; endbyte > inbyte; shift += 7) {
        uint64_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c & 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }